

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O0

void testcursors(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  Am_Drawonable *pAVar2;
  Am_Drawonable *pAVar3;
  Am_Drawonable *pAVar4;
  Am_Drawonable *pAVar5;
  byte bVar6;
  char *pcVar7;
  Am_Cursor local_190 [8];
  Am_Style local_188 [8];
  Am_Style local_180 [8];
  Am_Image_Array local_178 [8];
  Am_Image_Array local_170 [8];
  Am_Cursor local_168 [8];
  Am_Cursor rom_cursor;
  Am_Image_Array rom_mask;
  Am_Image_Array rom;
  Am_Style local_148 [8];
  Am_Style local_140 [8];
  Am_Image_Array local_138 [8];
  Am_Image_Array local_130 [8];
  Am_Cursor local_128 [8];
  Am_Cursor crosshair_cursor;
  Am_Image_Array crosshair_mask;
  Am_Image_Array crosshair;
  Am_Style local_108 [8];
  Am_Style local_100 [8];
  Am_Image_Array local_f8 [8];
  Am_Image_Array local_f0 [8];
  Am_Cursor local_e8 [8];
  Am_Cursor borg_cursor;
  Am_Image_Array borg_mask;
  Am_Image_Array borg;
  Am_Style local_c8 [8];
  Am_Style local_c0 [8];
  Am_Image_Array local_b8 [8];
  Am_Image_Array local_b0 [8];
  Am_Cursor local_a8 [8];
  Am_Cursor ds9_cursor;
  Am_Image_Array ds9_mask;
  Am_Image_Array ds9;
  Am_Style local_88 [8];
  Am_Style local_80 [8];
  Am_Image_Array local_78 [8];
  Am_Image_Array local_70 [8];
  Am_Cursor local_68 [8];
  Am_Cursor happy_cursor;
  Am_Image_Array local_50 [8];
  Am_Image_Array happy_mask;
  Am_Image_Array happy;
  Am_Drawonable *d5;
  Am_Drawonable *d4;
  Am_Drawonable *d3;
  Am_Drawonable *d2;
  Am_Drawonable *d1;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  for (d1._0_4_ = 0; (int)d1 < ar_len; d1._0_4_ = (int)d1 + 1) {
    pAVar1 = wins_ar[(int)d1].d1;
    pAVar2 = wins_ar[(int)d1].d2;
    pAVar3 = wins_ar[(int)d1].d3;
    pAVar4 = wins_ar[(int)d1].d4;
    pAVar5 = wins_ar[(int)d1].d5;
    pcVar7 = (char *)Am_Merge_Pathname("images/happy.xbm");
    Am_Image_Array::Am_Image_Array(&happy_mask,pcVar7);
    pcVar7 = (char *)Am_Merge_Pathname("images/happy_mask.xbm");
    Am_Image_Array::Am_Image_Array(local_50,pcVar7);
    Am_Image_Array::Am_Image_Array(local_70,&happy_mask);
    Am_Image_Array::Am_Image_Array(local_78,local_50);
    Am_Style::Am_Style(local_80,(Am_Style *)&Am_Purple);
    Am_Style::Am_Style(local_88,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(local_68,local_70,local_78,local_80,local_88);
    Am_Style::~Am_Style(local_88);
    Am_Style::~Am_Style(local_80);
    Am_Image_Array::~Am_Image_Array(local_78);
    Am_Image_Array::~Am_Image_Array(local_70);
    bVar6 = Am_Cursor::Valid();
    if ((bVar6 & 1) == 0) {
      fprintf(_stderr,"happy_cursor didn\'t work.\n");
    }
    else {
      Am_Cursor::Am_Cursor((Am_Cursor *)&ds9,local_68);
      (**(code **)(*(long *)pAVar1 + 0x1c0))(pAVar1,&ds9);
      Am_Cursor::~Am_Cursor((Am_Cursor *)&ds9);
    }
    pcVar7 = (char *)Am_Merge_Pathname("images/ds9.xbm");
    Am_Image_Array::Am_Image_Array(&ds9_mask,pcVar7);
    pcVar7 = (char *)Am_Merge_Pathname("images/ds9_mask.xbm");
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&ds9_cursor,pcVar7);
    Am_Image_Array::Am_Image_Array(local_b0,&ds9_mask);
    Am_Image_Array::Am_Image_Array(local_b8,(Am_Image_Array *)&ds9_cursor);
    Am_Style::Am_Style(local_c0,(Am_Style *)&Am_Blue);
    Am_Style::Am_Style(local_c8,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(local_a8,local_b0,local_b8,local_c0,local_c8);
    Am_Style::~Am_Style(local_c8);
    Am_Style::~Am_Style(local_c0);
    Am_Image_Array::~Am_Image_Array(local_b8);
    Am_Image_Array::~Am_Image_Array(local_b0);
    bVar6 = Am_Cursor::Valid();
    if ((bVar6 & 1) == 0) {
      fprintf(_stderr,"ds9_cursor didn\'t work.\n");
    }
    else {
      Am_Cursor::Am_Cursor((Am_Cursor *)&borg,local_a8);
      (**(code **)(*(long *)pAVar2 + 0x1c0))(pAVar2,&borg);
      Am_Cursor::~Am_Cursor((Am_Cursor *)&borg);
    }
    pcVar7 = (char *)Am_Merge_Pathname("images/borg.xbm");
    Am_Image_Array::Am_Image_Array(&borg_mask,pcVar7);
    pcVar7 = (char *)Am_Merge_Pathname("images/borg_mask.xbm");
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&borg_cursor,pcVar7);
    Am_Image_Array::Am_Image_Array(local_f0,&borg_mask);
    Am_Image_Array::Am_Image_Array(local_f8,(Am_Image_Array *)&borg_cursor);
    Am_Style::Am_Style(local_100,(Am_Style *)&Am_Red);
    Am_Style::Am_Style(local_108,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(local_e8,local_f0,local_f8,local_100,local_108);
    Am_Style::~Am_Style(local_108);
    Am_Style::~Am_Style(local_100);
    Am_Image_Array::~Am_Image_Array(local_f8);
    Am_Image_Array::~Am_Image_Array(local_f0);
    bVar6 = Am_Cursor::Valid();
    if ((bVar6 & 1) == 0) {
      fprintf(_stderr,"borg_cursor didn\'t work.\n");
    }
    else {
      Am_Cursor::Am_Cursor((Am_Cursor *)&crosshair,local_e8);
      (**(code **)(*(long *)pAVar3 + 0x1c0))(pAVar3,&crosshair);
      Am_Cursor::~Am_Cursor((Am_Cursor *)&crosshair);
    }
    pcVar7 = (char *)Am_Merge_Pathname("images/crosshair.xbm");
    Am_Image_Array::Am_Image_Array(&crosshair_mask,pcVar7);
    pcVar7 = (char *)Am_Merge_Pathname("images/crosshair_mask.xbm");
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&crosshair_cursor,pcVar7);
    Am_Image_Array::Am_Image_Array(local_130,&crosshair_mask);
    Am_Image_Array::Am_Image_Array(local_138,(Am_Image_Array *)&crosshair_cursor);
    Am_Style::Am_Style(local_140,(Am_Style *)&Am_Black);
    Am_Style::Am_Style(local_148,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(local_128,local_130,local_138,local_140,local_148);
    Am_Style::~Am_Style(local_148);
    Am_Style::~Am_Style(local_140);
    Am_Image_Array::~Am_Image_Array(local_138);
    Am_Image_Array::~Am_Image_Array(local_130);
    bVar6 = Am_Cursor::Valid();
    if ((bVar6 & 1) == 0) {
      fprintf(_stderr,"crosshair_cursor didn\'t work.\n");
    }
    else {
      Am_Cursor::Am_Cursor((Am_Cursor *)&rom,local_128);
      (**(code **)(*(long *)pAVar4 + 0x1c0))(pAVar4,&rom);
      Am_Cursor::~Am_Cursor((Am_Cursor *)&rom);
    }
    pcVar7 = (char *)Am_Merge_Pathname("images/rom.xbm");
    Am_Image_Array::Am_Image_Array(&rom_mask,pcVar7);
    pcVar7 = (char *)Am_Merge_Pathname("images/rom_mask.xbm");
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&rom_cursor,pcVar7);
    Am_Image_Array::Am_Image_Array(local_170,&rom_mask);
    Am_Image_Array::Am_Image_Array(local_178,(Am_Image_Array *)&rom_cursor);
    Am_Style::Am_Style(local_180,(Am_Style *)&Am_Green);
    Am_Style::Am_Style(local_188,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(local_168,local_170,local_178,local_180,local_188);
    Am_Style::~Am_Style(local_188);
    Am_Style::~Am_Style(local_180);
    Am_Image_Array::~Am_Image_Array(local_178);
    Am_Image_Array::~Am_Image_Array(local_170);
    bVar6 = Am_Cursor::Valid();
    if ((bVar6 & 1) == 0) {
      fprintf(_stderr,"rom_cursor didn\'t work.\n");
    }
    else {
      Am_Cursor::Am_Cursor(local_190,local_168);
      (**(code **)(*(long *)pAVar5 + 0x1c0))(pAVar5,local_190);
      Am_Cursor::~Am_Cursor(local_190);
    }
    Am_Cursor::~Am_Cursor(local_168);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&rom_cursor);
    Am_Image_Array::~Am_Image_Array(&rom_mask);
    Am_Cursor::~Am_Cursor(local_128);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&crosshair_cursor);
    Am_Image_Array::~Am_Image_Array(&crosshair_mask);
    Am_Cursor::~Am_Cursor(local_e8);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&borg_cursor);
    Am_Image_Array::~Am_Image_Array(&borg_mask);
    Am_Cursor::~Am_Cursor(local_a8);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&ds9_cursor);
    Am_Image_Array::~Am_Image_Array(&ds9_mask);
    Am_Cursor::~Am_Cursor(local_68);
    Am_Image_Array::~Am_Image_Array(local_50);
    Am_Image_Array::~Am_Image_Array(&happy_mask);
  }
  return;
}

Assistant:

void
testcursors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d1 = wins_ar[i].d1;
    Am_Drawonable *d2 = wins_ar[i].d2;
    Am_Drawonable *d3 = wins_ar[i].d3;
    Am_Drawonable *d4 = wins_ar[i].d4;
    Am_Drawonable *d5 = wins_ar[i].d5;

    Am_Image_Array happy(Am_Merge_Pathname(IMFN_HAPPY));
    Am_Image_Array happy_mask(Am_Merge_Pathname(IMFN_HAPPY_M));
    Am_Cursor happy_cursor(happy, happy_mask, Am_Purple, Am_White);
    if (happy_cursor.Valid())
      d1->Set_Cursor(happy_cursor);
    else
      fprintf(stderr, "happy_cursor didn't work.\n");

    Am_Image_Array ds9(Am_Merge_Pathname(IMFN_DS9));
    Am_Image_Array ds9_mask(Am_Merge_Pathname(IMFN_DS9_M));
    Am_Cursor ds9_cursor(ds9, ds9_mask, Am_Blue, Am_White);
    if (ds9_cursor.Valid())
      d2->Set_Cursor(ds9_cursor);
    else
      fprintf(stderr, "ds9_cursor didn't work.\n");

    Am_Image_Array borg(Am_Merge_Pathname(IMFN_BORG));
    Am_Image_Array borg_mask(Am_Merge_Pathname(IMFN_BORG_M));
    Am_Cursor borg_cursor(borg, borg_mask, Am_Red, Am_White);
    if (borg_cursor.Valid())
      d3->Set_Cursor(borg_cursor);
    else
      fprintf(stderr, "borg_cursor didn't work.\n");

    Am_Image_Array crosshair(Am_Merge_Pathname(IMFN_CROSSHR));
    Am_Image_Array crosshair_mask(Am_Merge_Pathname(IMFN_CROSSHR_M));
    Am_Cursor crosshair_cursor(crosshair, crosshair_mask, Am_Black, Am_White);
    if (crosshair_cursor.Valid())
      d4->Set_Cursor(crosshair_cursor);
    else
      fprintf(stderr, "crosshair_cursor didn't work.\n");

    Am_Image_Array rom(Am_Merge_Pathname(IMFN_ROM));
    Am_Image_Array rom_mask(Am_Merge_Pathname(IMFN_ROM_M));
    Am_Cursor rom_cursor(rom, rom_mask, Am_Green, Am_White);
    if (rom_cursor.Valid())
      d5->Set_Cursor(rom_cursor);
    else
      fprintf(stderr, "rom_cursor didn't work.\n");
  }
}